

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::ByteData::ByteData
          (ByteData *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  uint uVar1;
  string *message;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffff9c;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffffa0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_local;
  ByteData *this_local;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  message = (string *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if ((string *)(ulong)uVar1 < message) {
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_bytedata.cpp"
            ,0x2f);
    logger::warn<>((CfdSourceLocation *)&stack0xffffffffffffffd0,"It exceeds the handling size.");
    error_code = CONCAT13(SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0),
                          CONCAT12(1,(short)in_stack_ffffffffffffff9c));
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffa0,"It exceeds the handling size.",
               (allocator *)&stack0xffffffffffffff9f);
    CfdException::CfdException(in_stack_ffffffffffffffa0,error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

ByteData::ByteData(const std::vector<uint8_t>& vector) : data_(vector) {
  if (data_.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
}